

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

double FIX::DoubleConvertor::convert(string *value)

{
  bool bVar1;
  FieldConvertError *this;
  double local_18;
  double result;
  string *value_local;
  
  local_18 = 0.0;
  result = (double)value;
  bVar1 = convert(value,&local_18);
  if (!bVar1) {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,(string *)result);
    __cxa_throw(this,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  return local_18;
}

Assistant:

EXCEPT(FieldConvertError) {
    double result = 0.0;
    if (!convert(value, result)) {
      throw FieldConvertError(value);
    } else {
      return result;
    }
  }